

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::process_brackets
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  token_mblist *ptVar1;
  int iVar2;
  size_type sVar3;
  undefined8 extraout_RAX;
  compile_error *pcVar4;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *tokens_00;
  value_type *__x;
  value_type *pptVar5;
  value_type *pptVar6;
  allocator local_2a9;
  token_mblist *local_2a8;
  string local_2a0;
  undefined8 local_280;
  compiler_type *local_278;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *local_270;
  _Map_pointer local_268;
  deque<int,_std::allocator<int>_> blist_stack;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  blist;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_170;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_120;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_d0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> btokens;
  
  local_278 = this;
  if ((tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&oldt,"Received empty token buffer.",(allocator *)&blist)
    ;
    compile_error::compile_error(pcVar4,(string *)&oldt);
    __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  process_empty_brackets(this,tokens);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&oldt);
  std::swap<std::_Deque_base<cs::token_base*,std::allocator<cs::token_base*>>::_Deque_impl_data>
            ((_Deque_impl_data *)tokens,(_Deque_impl_data *)&oldt);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_Deque_base(&blist.
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               );
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&btokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            (&blist_stack.super__Deque_base<int,_std::allocator<int>_>);
  local_268 = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  __x = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  pptVar5 = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pptVar6 = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  local_270 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
  do {
    tokens_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)&btokens;
    if (__x == pptVar6) {
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur !=
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_2a0,"Parentheses do not match.",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                (&blist_stack.super__Deque_base<int,_std::allocator<int>_>);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&btokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque(&blist);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      return;
    }
    iVar2 = (*(*__x)->_vptr_token_base[2])();
    if (iVar2 != 3) goto LAB_00145d82;
    switch(*(int *)&(*__x)[1]._vptr_token_base) {
    case 0x1e:
      local_2a0._M_dataplus._M_p._0_4_ = 1;
      std::deque<int,_std::allocator<int>_>::emplace_front<int>(&blist_stack,(int *)&local_2a0);
      goto LAB_00145bb5;
    case 0x1f:
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_2a0,"Parentheses do not match.",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      if (*blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur != 1) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_2a0,
                   "The parentheses type does not match.(Request Small Bracket)",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::pop_front(&blist_stack);
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur !=
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) break;
      process_brackets(local_278,
                       (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)tokens_00);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::push_back(&blist,(value_type *)tokens_00);
      local_2a8 = (token_mblist *)token_base::operator_new((token_base *)0x60,(size_t)tokens_00);
      local_280 = pptVar6;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque(&local_d0,&blist);
      ptVar1 = local_2a8;
      token_sblist::token_sblist((token_sblist *)local_2a8,&local_d0);
      local_2a0._M_dataplus._M_p = (pointer)ptVar1;
      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                 (token_base **)&local_2a0);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque(&local_d0);
      pptVar6 = local_280;
LAB_00145e4b:
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::clear(&blist);
LAB_00145e60:
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(&btokens);
      goto LAB_00145d9e;
    case 0x20:
      local_2a0._M_dataplus._M_p._0_4_ = 2;
      std::deque<int,_std::allocator<int>_>::emplace_front<int>(&blist_stack,(int *)&local_2a0);
      goto LAB_00145bb5;
    case 0x21:
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_2a0,"Parentheses do not match.",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      if (*blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur != 2) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_2a0,
                   "The parentheses type does not match.(Request Middle Bracket)",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::pop_front(&blist_stack);
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) {
        process_brackets(local_278,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)tokens_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back(&blist,(value_type *)tokens_00);
        local_2a8 = (token_mblist *)token_base::operator_new((token_base *)0x60,(size_t)tokens_00);
        local_280 = pptVar5;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque(&local_120,&blist);
        ptVar1 = local_2a8;
        token_mblist::token_mblist(local_2a8,&local_120);
        local_2a0._M_dataplus._M_p = (pointer)ptVar1;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                   (token_base **)&local_2a0);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque(&local_120);
        pptVar5 = local_280;
        goto LAB_00145e4b;
      }
      break;
    case 0x22:
      local_2a0._M_dataplus._M_p._0_4_ = 3;
      std::deque<int,_std::allocator<int>_>::emplace_front<int>(&blist_stack,(int *)&local_2a0);
LAB_00145bb5:
      sVar3 = std::deque<int,_std::allocator<int>_>::size(&blist_stack);
      tokens = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_270;
      if (sVar3 != 1) break;
      goto LAB_00145d9e;
    case 0x23:
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_2a0,"Parentheses do not match.",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      if (*blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur != 3) {
        pcVar4 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_2a0,
                   "The parentheses type does not match.(Request Large Bracket)",&local_2a9);
        compile_error::compile_error(pcVar4,&local_2a0);
        __cxa_throw(pcVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::pop_front(&blist_stack);
      if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur) {
        process_brackets(local_278,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)tokens_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back(&blist,(value_type *)tokens_00);
        local_2a8 = (token_mblist *)token_base::operator_new((token_base *)0x60,(size_t)tokens_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque(&local_170,&blist);
        ptVar1 = local_2a8;
        local_280._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        token_lblist::token_lblist((token_lblist *)local_2a8,&local_170);
        local_2a0._M_dataplus._M_p = (pointer)ptVar1;
        local_280 = (value_type *)((ulong)local_280._4_4_ << 0x20);
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                   (token_base **)&local_2a0);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque(&local_170);
        goto LAB_00145e4b;
      }
      break;
    default:
      if ((*(int *)&(*__x)[1]._vptr_token_base == 0xd) &&
         (sVar3 = std::deque<int,_std::allocator<int>_>::size(&blist_stack), sVar3 == 1)) {
        process_brackets(local_278,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)tokens_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back(&blist,(value_type *)tokens_00);
        goto LAB_00145e60;
      }
    }
LAB_00145d82:
    if (blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        blist_stack.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      tokens_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
    }
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)tokens_00,__x);
LAB_00145d9e:
    __x = __x + 1;
    if (__x == pptVar5) {
      __x = local_268[1];
      local_268 = local_268 + 1;
      pptVar5 = __x + 0x40;
    }
  } while( true );
}

Assistant:

void compiler_type::process_brackets(std::deque<token_base *> &tokens)
	{
		if (tokens.empty())
			throw compile_error("Received empty token buffer.");
		process_empty_brackets(tokens);
		std::deque<token_base *> oldt;
		std::swap(tokens, oldt);
		tokens.clear();
		std::deque<std::deque<token_base *>> blist;
		std::deque<token_base *> btokens;
		std::deque<int> blist_stack;
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal) {
				switch (static_cast<token_signal *>(ptr)->get_signal()) {
				default:
					break;
				case signal_types::slb_:
					blist_stack.push_front(1);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::mlb_:
					blist_stack.push_front(2);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::llb_:
					blist_stack.push_front(3);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::srb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 1)
						throw compile_error("The parentheses type does not match.(Request Small Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_sblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::mrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 2)
						throw compile_error("The parentheses type does not match.(Request Middle Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_mblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::lrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 3)
						throw compile_error("The parentheses type does not match.(Request Large Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_lblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::com_:
					if (blist_stack.size() == 1) {
						process_brackets(btokens);
						blist.push_back(btokens);
						btokens.clear();
						continue;
					}
					break;
				}
			}
			if (blist_stack.empty())
				tokens.push_back(ptr);
			else
				btokens.push_back(ptr);
		}
		if (!blist_stack.empty())
			throw compile_error("Parentheses do not match.");
	}